

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_resetDStream(ZSTD_DStream *dctx)

{
  uint uVar1;
  undefined8 in_RDI;
  size_t err_code;
  ZSTD_DCtx *in_stack_ffffffffffffffe8;
  ZSTD_format_e format;
  undefined8 local_8;
  
  format = (ZSTD_format_e)((ulong)in_RDI >> 0x20);
  local_8 = ZSTD_DCtx_reset(in_stack_ffffffffffffffe8,0);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    local_8 = ZSTD_startingInputLength(format);
  }
  return local_8;
}

Assistant:

size_t ZSTD_resetDStream(ZSTD_DStream* dctx)
{
    DEBUGLOG(4, "ZSTD_resetDStream");
    FORWARD_IF_ERROR(ZSTD_DCtx_reset(dctx, ZSTD_reset_session_only), "");
    return ZSTD_startingInputLength(dctx->format);
}